

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputDCTDecodeStream.cpp
# Opt level: O3

LongBufferSizeType __thiscall
InputDCTDecodeStream::Read
          (InputDCTDecodeStream *this,Byte *inBuffer,LongBufferSizeType inBufferSize)

{
  EStatusCode EVar1;
  JDIMENSION JVar2;
  Byte *inBuffer_00;
  LongBufferSizeType LVar3;
  
  if ((this->mIsDecoding == true) &&
     ((this->mIsHeaderRead != false || (EVar1 = StartRead(this), EVar1 == eSuccess)))) {
    inBuffer_00 = CopySamplesArrayToBuffer(this,inBuffer,inBufferSize);
    LVar3 = (long)inBuffer_00 - (long)inBuffer;
    if (LVar3 < inBufferSize) {
      do {
        if ((this->mJPGState).output_height <= (this->mJPGState).output_scanline) {
          return LVar3;
        }
        JVar2 = jpeg_read_scanlines(&this->mJPGState,this->mSamplesBuffer,
                                    (this->mJPGState).rec_outbuf_height);
        this->mTotalSampleRows = (ulong)JVar2;
        this->mIndexInRow = 0;
        this->mCurrentSampleRow = 0;
        inBuffer_00 = CopySamplesArrayToBuffer(this,inBuffer_00,inBufferSize - LVar3);
        LVar3 = (long)inBuffer_00 - (long)inBuffer;
      } while (LVar3 < inBufferSize);
    }
  }
  else {
    LVar3 = 0;
  }
  return LVar3;
}

Assistant:

LongBufferSizeType InputDCTDecodeStream::Read(
                                                Byte* inBuffer,
                                                LongBufferSizeType inBufferSize)
{
	if(!mIsDecoding)
		return 0;
    
    if(!mIsHeaderRead)
    {
        if(StartRead() != eSuccess)
            return 0;
    }

    Byte* indexInBuffer = inBuffer;
    
    // fill buffer with what remains from samples buffer
    indexInBuffer = CopySamplesArrayToBuffer(inBuffer,inBufferSize);
 
    // if not satisfied, loop by reading more samples, and filling the buffer.
    // if while reading for samples encountered end of filter, stop
    while(((LongBufferSizeType)(indexInBuffer - inBuffer) < inBufferSize) && (mJPGState.output_scanline < mJPGState.output_height))
    {
        try
        {
            mTotalSampleRows = jpeg_read_scanlines(&mJPGState, mSamplesBuffer, mJPGState.rec_outbuf_height);
        }
        catch(HummusJPGException)
        {
            TRACE_LOG("InputDCTDecodeStream::Read, caught exception in jpg decoding");
            mTotalSampleRows = 0;
        }
        mIndexInRow = 0;
        mCurrentSampleRow = 0;
        indexInBuffer = CopySamplesArrayToBuffer(indexInBuffer,inBufferSize - (indexInBuffer - inBuffer));
    }
    return indexInBuffer - inBuffer;
}